

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solitaire.cpp
# Opt level: O0

TableauPile * __thiscall solitaire::Solitaire::getTableauPile(Solitaire *this,PileId *id)

{
  uint *puVar1;
  __shared_ptr_access<solitaire::piles::interfaces::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_00;
  element_type *peVar2;
  PileId local_1c;
  PileId *local_18;
  PileId *id_local;
  Solitaire *this_local;
  
  local_18 = id;
  id_local = (PileId *)this;
  piles::PileId::PileId(&local_1c,id);
  throwExceptionOnInvalidTableauPileId(this,&local_1c);
  puVar1 = piles::PileId::operator_cast_to_unsigned_int_(id);
  this_00 = (__shared_ptr_access<solitaire::piles::interfaces::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             *)std::array<std::shared_ptr<solitaire::piles::interfaces::TableauPile>,_7UL>::
               operator[](&this->tableauPiles,(ulong)*puVar1);
  peVar2 = std::
           __shared_ptr_access<solitaire::piles::interfaces::TableauPile,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator*(this_00);
  return peVar2;
}

Assistant:

const TableauPile& Solitaire::getTableauPile(const PileId id) const {
    throwExceptionOnInvalidTableauPileId(id);
    return *tableauPiles[id];
}